

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opldumper_mididevice.cpp
# Opt level: O0

int __thiscall DiskWriterIO::OPLinit(DiskWriterIO *this,uint numchips,bool param_2,bool initopl3)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  FILE *file_00;
  size_t sVar4;
  OPL_RDOSdump *this_00;
  OPL_DOSBOXdump *this_01;
  FILE *file;
  bool initopl3_local;
  bool param_2_local;
  uint numchips_local;
  DiskWriterIO *this_local;
  
  pcVar3 = FString::operator_cast_to_char_(&this->Filename);
  file_00 = fopen(pcVar3,"wb");
  if (file_00 == (FILE *)0x0) {
    pcVar3 = FString::GetChars(&this->Filename);
    Printf("Could not open %s for writing.\n",pcVar3);
    return 0;
  }
  uVar1 = clamp<unsigned_int>(numchips,1,2);
  memset((this->super_OPLio).chips,0,0x40);
  sVar4 = FString::Len(&this->Filename);
  if (4 < sVar4) {
    sVar4 = FString::Len(&this->Filename);
    pcVar3 = FString::operator[](&this->Filename,sVar4 - 4);
    iVar2 = strcasecmp(pcVar3,".dro");
    if (iVar2 == 0) {
      this_01 = (OPL_DOSBOXdump *)operator_new(0x30);
      OPL_DOSBOXdump::OPL_DOSBOXdump(this_01,(FILE *)file_00,1 < uVar1);
      (this->super_OPLio).chips[0] = (OPLEmul *)this_01;
      goto LAB_00409bac;
    }
  }
  this_00 = (OPL_RDOSdump *)operator_new(0x30);
  OPL_RDOSdump::OPL_RDOSdump(this_00,(FILE *)file_00);
  (this->super_OPLio).chips[0] = (OPLEmul *)this_00;
LAB_00409bac:
  (this->super_OPLio).OPLchannels = uVar1 * 9;
  (this->super_OPLio).NumChips = uVar1;
  (this->super_OPLio).IsOPL3 = 1 < uVar1;
  OPLio::OPLwriteInitState(&this->super_OPLio,initopl3);
  return uVar1;
}

Assistant:

int DiskWriterIO::OPLinit(uint numchips, bool, bool initopl3)
{
	FILE *file = fopen(Filename, "wb");
	if (file == NULL)
	{
		Printf("Could not open %s for writing.\n", Filename.GetChars());
		return 0;
	}

	numchips = clamp(numchips, 1u, 2u);
	memset(chips, 0, sizeof(chips));
	// If the file extension is unknown or not present, the default format
	// is RAW. Otherwise, you can use DRO.
	if (Filename.Len() < 5 || stricmp(&Filename[Filename.Len() - 4], ".dro") != 0)
	{
		chips[0] = new OPL_RDOSdump(file);
	}
	else
	{
		chips[0] = new OPL_DOSBOXdump(file, numchips > 1);
	}
	OPLchannels = OPL2CHANNELS * numchips;
	NumChips = numchips;
	IsOPL3 = numchips > 1;
	OPLwriteInitState(initopl3);
	return numchips;
}